

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateCommandVoid1Return
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,size_t returnParam,
          bool raii)

{
  initializer_list<Flags<CommandFlavourFlagBits>_> __l;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_02;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_03;
  initializer_list<unsigned_long> __l_04;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_05;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_06;
  initializer_list<unsigned_long> __l_07;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_08;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_09;
  initializer_list<unsigned_long> __l_10;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_11;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_12;
  initializer_list<unsigned_long> __l_13;
  initializer_list<unsigned_long> __l_14;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_15;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_16;
  initializer_list<unsigned_long> __l_17;
  byte bVar1;
  byte bVar2;
  bool bVar3;
  __type_conflict _Var4;
  const_reference pvVar5;
  size_type sVar6;
  pointer ppVar7;
  const_reference param;
  byte local_839;
  allocator<char> local_603;
  allocator<Flags<CommandFlavourFlagBits>_> local_602;
  Flags<CommandFlavourFlagBits> local_601;
  Flags<CommandFlavourFlagBits> *local_600;
  size_type local_5f8;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_5f0;
  allocator<Flags<CommandFlavourFlagBits>_> local_5d2;
  Flags<CommandFlavourFlagBits> local_5d1;
  Flags<CommandFlavourFlagBits> *local_5d0;
  size_type local_5c8;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_5c0;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_5a8;
  allocator<unsigned_long> local_571;
  size_t local_570;
  iterator local_568;
  size_type local_560;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_558;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_540;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_538;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_530;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_528;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_520;
  allocator<Flags<CommandFlavourFlagBits>_> local_512;
  Flags<CommandFlavourFlagBits> local_511;
  Flags<CommandFlavourFlagBits> *local_510;
  size_type local_508;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_500;
  allocator<Flags<CommandFlavourFlagBits>_> local_4e3;
  Flags<CommandFlavourFlagBits> local_4e2;
  Flags<CommandFlavourFlagBits> local_4e1;
  Flags<CommandFlavourFlagBits> *local_4e0;
  size_type local_4d8;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_4d0;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_4b8;
  allocator<unsigned_long> local_481;
  size_t local_480;
  iterator local_478;
  size_type local_470;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_468;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_450;
  allocator<Flags<CommandFlavourFlagBits>_> local_442;
  Flags<CommandFlavourFlagBits> local_441;
  Flags<CommandFlavourFlagBits> *local_440;
  size_type local_438;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_430;
  allocator<Flags<CommandFlavourFlagBits>_> local_412;
  Flags<CommandFlavourFlagBits> local_411;
  Flags<CommandFlavourFlagBits> *local_410;
  size_type local_408;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_400;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_3e8;
  allocator<unsigned_long> local_3b1;
  size_t local_3b0;
  iterator local_3a8;
  size_type local_3a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_398;
  allocator<Flags<CommandFlavourFlagBits>_> local_37b;
  Flags<CommandFlavourFlagBits> local_37a;
  Flags<CommandFlavourFlagBits> local_379;
  Flags<CommandFlavourFlagBits> *local_378;
  size_type local_370;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_368;
  allocator<Flags<CommandFlavourFlagBits>_> local_34b;
  Flags<CommandFlavourFlagBits> local_34a;
  Flags<CommandFlavourFlagBits> local_349;
  Flags<CommandFlavourFlagBits> *local_348;
  size_type local_340;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_338;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_320;
  allocator<unsigned_long> local_2e9;
  size_t local_2e8;
  iterator local_2e0;
  size_type local_2d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2d0;
  allocator<Flags<CommandFlavourFlagBits>_> local_2b2;
  Flags<CommandFlavourFlagBits> local_2b1;
  Flags<CommandFlavourFlagBits> *local_2b0;
  size_type local_2a8;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_2a0;
  allocator<Flags<CommandFlavourFlagBits>_> local_282;
  Flags<CommandFlavourFlagBits> local_281;
  Flags<CommandFlavourFlagBits> *local_280;
  size_type local_278;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_270;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_258;
  allocator<unsigned_long> local_221;
  size_t local_220;
  iterator local_218;
  size_type local_210;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_208;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_1f0;
  allocator<unsigned_long> local_1b9;
  size_t local_1b8;
  iterator local_1b0;
  size_type local_1a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1a0;
  Flags<CommandFlavourFlagBits> local_184;
  CommandFlavourFlagBits local_183 [2];
  value_type local_181;
  undefined1 local_180 [8];
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
  flavourFlags;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_> local_148;
  undefined4 local_140;
  allocator<Flags<CommandFlavourFlagBits>_> local_13a;
  Flags<CommandFlavourFlagBits> local_139;
  Flags<CommandFlavourFlagBits> *local_138;
  size_type local_130;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_128;
  allocator<Flags<CommandFlavourFlagBits>_> local_10a;
  Flags<CommandFlavourFlagBits> local_109;
  Flags<CommandFlavourFlagBits> *local_108;
  size_type local_100;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> local_f8;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_e0;
  allocator<unsigned_long> local_a9;
  size_t local_a8;
  iterator local_a0;
  size_type local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  undefined1 local_68 [8];
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams;
  bool raii_local;
  bool definition_local;
  size_t initialSkipCount_local;
  CommandData *commandData_local;
  string *name_local;
  VulkanHppGenerator *this_local;
  
  vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = raii;
  vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = definition;
  determineVectorParams
            ((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
              *)local_68,this,&commandData->params);
  pvVar5 = std::
           vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>::
           operator[](&commandData->params,returnParam);
  bVar3 = std::operator==(&(pvVar5->type).type,"void");
  if (bVar3) {
    sVar6 = std::
            map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
            ::size((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                    *)local_68);
    bVar2 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_;
    if (sVar6 == 0) {
      local_a8 = returnParam;
      local_a0 = &local_a8;
      local_98 = 1;
      std::allocator<unsigned_long>::allocator(&local_a9);
      __l_17._M_len = local_98;
      __l_17._M_array = local_a0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_90,__l_17,&local_a9)
      ;
      std::
      map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
      ::map(&local_e0,
            (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
             *)local_68);
      Flags<CommandFlavourFlagBits>::Flags(&local_109,enhanced);
      local_100 = 1;
      local_108 = &local_109;
      std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_10a);
      __l_16._M_len = local_100;
      __l_16._M_array = local_108;
      std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      vector(&local_f8,__l_16,&local_10a);
      bVar1 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_;
      Flags<CommandFlavourFlagBits>::Flags(&local_139,enhanced);
      local_130 = 1;
      local_138 = &local_139;
      std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_13a);
      __l_15._M_len = local_130;
      __l_15._M_array = local_138;
      std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      vector(&local_128,__l_15,&local_13a);
      generateCommandSetInclusive
                (__return_storage_ptr__,this,name,commandData,initialSkipCount,(bool)(bVar2 & 1),
                 &local_90,&local_e0,false,&local_f8,(bool)(bVar1 & 1),false,&local_128);
      std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      ~vector(&local_128);
      std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_13a);
      std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      ~vector(&local_f8);
      std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_10a);
      std::
      map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
      ::~map(&local_e0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_90);
      std::allocator<unsigned_long>::~allocator(&local_a9);
      local_140 = 1;
      goto LAB_001762ac;
    }
    if (sVar6 == 1) {
      local_148._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
           ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                    *)local_68);
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
               ::operator->(&local_148);
      if (returnParam == ppVar7->first) {
        stripPluralS((string *)
                     &flavourFlags.
                      super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,this,name);
        _Var4 = std::operator==(name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&flavourFlags.
                                         super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &flavourFlags.
                    super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (_Var4) {
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          vector((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                  *)local_180);
          bVar3 = std::operator==(name,"vkGetDescriptorEXT");
          if (bVar3) {
            local_183[1] = 0x20;
            local_183[0] = keepVoidPtr;
            local_181.m_mask = (MaskType)operator|(local_183 + 1,local_183);
            std::
            vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
            push_back((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                       *)local_180,&local_181);
          }
          Flags<CommandFlavourFlagBits>::Flags(&local_184,singular);
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          push_back((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                     *)local_180,&local_184);
          bVar2 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_;
          local_1b8 = returnParam;
          local_1b0 = &local_1b8;
          local_1a8 = 1;
          std::allocator<unsigned_long>::allocator(&local_1b9);
          __l_14._M_len = local_1a8;
          __l_14._M_array = local_1b0;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_1a0,__l_14,&local_1b9);
          std::
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::map(&local_1f0,
                (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                 *)local_68);
          generateCommandSetInclusive
                    (__return_storage_ptr__,this,name,commandData,initialSkipCount,(bool)(bVar2 & 1)
                     ,&local_1a0,&local_1f0,false,
                     (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      *)local_180,
                     (bool)(vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1)
                     ,false,(vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                             *)local_180);
          std::
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::~map(&local_1f0);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_1a0);
          std::allocator<unsigned_long>::~allocator(&local_1b9);
          local_140 = 1;
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          ~vector((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                   *)local_180);
          goto LAB_001762ac;
        }
      }
    }
  }
  else {
    pvVar5 = std::
             vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>::
             operator[](&commandData->params,returnParam);
    bVar3 = isHandleType(this,&(pvVar5->type).type);
    if (bVar3) {
      bVar3 = std::
              map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
              ::empty((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                       *)local_68);
      bVar2 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_;
      if (bVar3) {
        local_220 = returnParam;
        local_218 = &local_220;
        local_210 = 1;
        std::allocator<unsigned_long>::allocator(&local_221);
        __l_13._M_len = local_210;
        __l_13._M_array = local_218;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_208,__l_13,&local_221);
        std::
        map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::map(&local_258,
              (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
               *)local_68);
        Flags<CommandFlavourFlagBits>::Flags(&local_281,enhanced);
        local_278 = 1;
        local_280 = &local_281;
        std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_282);
        __l_12._M_len = local_278;
        __l_12._M_array = local_280;
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::vector(&local_270,__l_12,&local_282);
        bVar1 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_;
        Flags<CommandFlavourFlagBits>::Flags(&local_2b1,enhanced);
        local_2a8 = 1;
        local_2b0 = &local_2b1;
        std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_2b2);
        __l_11._M_len = local_2a8;
        __l_11._M_array = local_2b0;
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::vector(&local_2a0,__l_11,&local_2b2);
        generateCommandSetInclusive
                  (__return_storage_ptr__,this,name,commandData,initialSkipCount,(bool)(bVar2 & 1),
                   &local_208,&local_258,false,&local_270,(bool)(bVar1 & 1),true,&local_2a0);
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::~vector(&local_2a0);
        std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_2b2);
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::~vector(&local_270);
        std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_282);
        std::
        map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::~map(&local_258);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_208);
        std::allocator<unsigned_long>::~allocator(&local_221);
        local_140 = 1;
        goto LAB_001762ac;
      }
    }
    else {
      pvVar5 = std::
               vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
               ::operator[](&commandData->params,returnParam);
      bVar3 = isStructureChainAnchor(this,&(pvVar5->type).type);
      if (bVar3) {
        bVar3 = std::
                map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                ::empty((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                         *)local_68);
        bVar2 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_;
        if (bVar3) {
          local_2e8 = returnParam;
          local_2e0 = &local_2e8;
          local_2d8 = 1;
          std::allocator<unsigned_long>::allocator(&local_2e9);
          __l_10._M_len = local_2d8;
          __l_10._M_array = local_2e0;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_2d0,__l_10,&local_2e9);
          std::
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::map(&local_320,
                (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                 *)local_68);
          Flags<CommandFlavourFlagBits>::Flags(&local_34a,enhanced);
          Flags<CommandFlavourFlagBits>::Flags(&local_349,chained);
          local_340 = 2;
          local_348 = &local_34a;
          std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_34b);
          __l_09._M_len = local_340;
          __l_09._M_array = local_348;
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          vector(&local_338,__l_09,&local_34b);
          bVar1 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_;
          Flags<CommandFlavourFlagBits>::Flags(&local_37a,enhanced);
          Flags<CommandFlavourFlagBits>::Flags(&local_379,chained);
          local_370 = 2;
          local_378 = &local_37a;
          std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_37b);
          __l_08._M_len = local_370;
          __l_08._M_array = local_378;
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          vector(&local_368,__l_08,&local_37b);
          generateCommandSetInclusive
                    (__return_storage_ptr__,this,name,commandData,initialSkipCount,(bool)(bVar2 & 1)
                     ,&local_2d0,&local_320,false,&local_338,(bool)(bVar1 & 1),false,&local_368);
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          ~vector(&local_368);
          std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_37b);
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          ~vector(&local_338);
          std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_34b);
          std::
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::~map(&local_320);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_2d0);
          std::allocator<unsigned_long>::~allocator(&local_2e9);
          local_140 = 1;
          goto LAB_001762ac;
        }
      }
      else {
        sVar6 = std::
                map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                ::size((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                        *)local_68);
        bVar2 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_;
        if (sVar6 == 0) {
          local_3b0 = returnParam;
          local_3a8 = &local_3b0;
          local_3a0 = 1;
          std::allocator<unsigned_long>::allocator(&local_3b1);
          __l_07._M_len = local_3a0;
          __l_07._M_array = local_3a8;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_398,__l_07,&local_3b1);
          std::
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::map(&local_3e8,
                (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                 *)local_68);
          Flags<CommandFlavourFlagBits>::Flags(&local_411,enhanced);
          local_408 = 1;
          local_410 = &local_411;
          std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_412);
          __l_06._M_len = local_408;
          __l_06._M_array = local_410;
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          vector(&local_400,__l_06,&local_412);
          bVar1 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_;
          Flags<CommandFlavourFlagBits>::Flags(&local_441,enhanced);
          local_438 = 1;
          local_440 = &local_441;
          std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_442);
          __l_05._M_len = local_438;
          __l_05._M_array = local_440;
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          vector(&local_430,__l_05,&local_442);
          generateCommandSetInclusive
                    (__return_storage_ptr__,this,name,commandData,initialSkipCount,(bool)(bVar2 & 1)
                     ,&local_398,&local_3e8,false,&local_400,(bool)(bVar1 & 1),false,&local_430);
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          ~vector(&local_430);
          std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_442);
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          ~vector(&local_400);
          std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_412);
          std::
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::~map(&local_3e8);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_398);
          std::allocator<unsigned_long>::~allocator(&local_3b1);
          local_140 = 1;
          goto LAB_001762ac;
        }
        if (sVar6 == 1) {
          local_450._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
               ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                        *)local_68);
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                   ::operator->(&local_450);
          bVar2 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_;
          if (returnParam == ppVar7->first) {
            local_480 = returnParam;
            local_478 = &local_480;
            local_470 = 1;
            std::allocator<unsigned_long>::allocator(&local_481);
            __l_04._M_len = local_470;
            __l_04._M_array = local_478;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      (&local_468,__l_04,&local_481);
            std::
            map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
            ::map(&local_4b8,
                  (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                   *)local_68);
            Flags<CommandFlavourFlagBits>::Flags(&local_4e2,enhanced);
            Flags<CommandFlavourFlagBits>::Flags(&local_4e1,withAllocator);
            local_4d8 = 2;
            local_4e0 = &local_4e2;
            std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_4e3);
            __l_03._M_len = local_4d8;
            __l_03._M_array = local_4e0;
            std::
            vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
            vector(&local_4d0,__l_03,&local_4e3);
            bVar1 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_;
            Flags<CommandFlavourFlagBits>::Flags(&local_511,enhanced);
            local_508 = 1;
            local_510 = &local_511;
            std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_512);
            __l_02._M_len = local_508;
            __l_02._M_array = local_510;
            std::
            vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
            vector(&local_500,__l_02,&local_512);
            generateCommandSetInclusive
                      (__return_storage_ptr__,this,name,commandData,initialSkipCount,
                       (bool)(bVar2 & 1),&local_468,&local_4b8,false,&local_4d0,(bool)(bVar1 & 1),
                       false,&local_500);
            std::
            vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
            ~vector(&local_500);
            std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_512);
            std::
            vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
            ~vector(&local_4d0);
            std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_4e3);
            std::
            map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
            ::~map(&local_4b8);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_468);
            std::allocator<unsigned_long>::~allocator(&local_481);
            local_140 = 1;
            goto LAB_001762ac;
          }
          local_520._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
               ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                        *)local_68);
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                   ::operator->(&local_520);
          pvVar5 = std::
                   vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                   ::operator[](&commandData->params,ppVar7->first);
          bVar3 = isHandleType(this,&(pvVar5->type).type);
          local_839 = 0;
          if (!bVar3) {
            local_528._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                 ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                          *)local_68);
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                     ::operator->(&local_528);
            pvVar5 = std::
                     vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                     ::operator[](&commandData->params,ppVar7->first);
            bVar3 = isStructureChainAnchor(this,&(pvVar5->type).type);
            local_839 = 0;
            if (!bVar3) {
              local_530._M_node =
                   (_Base_ptr)
                   std::
                   map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                   ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                            *)local_68);
              ppVar7 = std::
                       _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                       ::operator->(&local_530);
              pvVar5 = std::
                       vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                       ::operator[](&commandData->params,ppVar7->first);
              bVar3 = std::operator==(&(pvVar5->type).type,"void");
              local_839 = bVar3 ^ 0xff;
            }
          }
          if ((local_839 & 1) != 0) {
            local_538._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                 ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                          *)local_68);
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                     ::operator->(&local_538);
            pvVar5 = std::
                     vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                     ::operator[](&commandData->params,ppVar7->first);
            local_540._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                 ::begin((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                          *)local_68);
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>
                     ::operator->(&local_540);
            param = std::
                    vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                    ::operator[](&commandData->params,(ppVar7->second).lenParam);
            bVar3 = isLenByStructMember(this,&pvVar5->lenExpression,param);
            bVar2 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_;
            if (bVar3) {
              local_570 = returnParam;
              local_568 = &local_570;
              local_560 = 1;
              std::allocator<unsigned_long>::allocator(&local_571);
              __l_01._M_len = local_560;
              __l_01._M_array = local_568;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_558,__l_01,&local_571);
              std::
              map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
              ::map(&local_5a8,
                    (map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                     *)local_68);
              Flags<CommandFlavourFlagBits>::Flags(&local_5d1,enhanced);
              local_5c8 = 1;
              local_5d0 = &local_5d1;
              std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_5d2);
              __l_00._M_len = local_5c8;
              __l_00._M_array = local_5d0;
              std::
              vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ::vector(&local_5c0,__l_00,&local_5d2);
              bVar1 = vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_;
              Flags<CommandFlavourFlagBits>::Flags(&local_601,enhanced);
              local_5f8 = 1;
              local_600 = &local_601;
              std::allocator<Flags<CommandFlavourFlagBits>_>::allocator(&local_602);
              __l._M_len = local_5f8;
              __l._M_array = local_600;
              std::
              vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ::vector(&local_5f0,__l,&local_602);
              generateCommandSetInclusive
                        (__return_storage_ptr__,this,name,commandData,initialSkipCount,
                         (bool)(bVar2 & 1),&local_558,&local_5a8,false,&local_5c0,(bool)(bVar1 & 1),
                         false,&local_5f0);
              std::
              vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ::~vector(&local_5f0);
              std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_602);
              std::
              vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ::~vector(&local_5c0);
              std::allocator<Flags<CommandFlavourFlagBits>_>::~allocator(&local_5d2);
              std::
              map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
              ::~map(&local_5a8);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_558);
              std::allocator<unsigned_long>::~allocator(&local_571);
              local_140 = 1;
              goto LAB_001762ac;
            }
          }
        }
      }
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_603)
  ;
  std::allocator<char>::~allocator(&local_603);
  local_140 = 1;
LAB_001762ac:
  std::
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  ::~map((map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *)local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCommandVoid1Return(
  std::string const & name, CommandData const & commandData, size_t initialSkipCount, bool definition, size_t returnParam, bool raii ) const
{
  std::map<size_t, VectorParamData> vectorParams = determineVectorParams( commandData.params );
  if ( ( commandData.params[returnParam].type.type == "void" ) )
  {
    switch ( vectorParams.size() )
    {
      case 0:
        return generateCommandSetInclusive( name,
                                            commandData,
                                            initialSkipCount,
                                            definition,
                                            { returnParam },
                                            vectorParams,
                                            false,
                                            { CommandFlavourFlagBits::enhanced },
                                            raii,
                                            false,
                                            { CommandFlavourFlagBits::enhanced } );
      case 1:
        if ( returnParam == vectorParams.begin()->first )
        {
          if ( name == stripPluralS( name ) )
          {
            std::vector<CommandFlavourFlags> flavourFlags;
            if ( name == "vkGetDescriptorEXT" )
            {
              // special handling for this function: do not return the void*, but keep its argument as it is
              flavourFlags.push_back( CommandFlavourFlagBits::noReturn | CommandFlavourFlagBits::keepVoidPtr );
            }
            flavourFlags.push_back( CommandFlavourFlagBits::singular );
            return generateCommandSetInclusive(
              name, commandData, initialSkipCount, definition, { returnParam }, vectorParams, false, flavourFlags, raii, false, flavourFlags );
          }
        }
        break;
      default: break;
    }
  }
  else if ( isHandleType( commandData.params[returnParam].type.type ) )
  {
    if ( vectorParams.empty() )
    {
      return generateCommandSetInclusive( name,
                                          commandData,
                                          initialSkipCount,
                                          definition,
                                          { returnParam },
                                          vectorParams,
                                          false,
                                          { CommandFlavourFlagBits::enhanced },
                                          raii,
                                          true,
                                          { CommandFlavourFlagBits::enhanced } );
    }
  }
  else if ( isStructureChainAnchor( commandData.params[returnParam].type.type ) )
  {
    if ( vectorParams.empty() )
    {
      return generateCommandSetInclusive( name,
                                          commandData,
                                          initialSkipCount,
                                          definition,
                                          { returnParam },
                                          vectorParams,
                                          false,
                                          { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::chained },
                                          raii,
                                          false,
                                          { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::chained } );
    }
  }
  else
  {
    switch ( vectorParams.size() )
    {
      case 0:
        return generateCommandSetInclusive( name,
                                            commandData,
                                            initialSkipCount,
                                            definition,
                                            { returnParam },
                                            vectorParams,
                                            false,
                                            { CommandFlavourFlagBits::enhanced },
                                            raii,
                                            false,
                                            { CommandFlavourFlagBits::enhanced } );
      case 1:
        if ( returnParam == vectorParams.begin()->first )
        {
          // you get a vector of stuff, with the size being one of the parameters
          return generateCommandSetInclusive( name,
                                              commandData,
                                              initialSkipCount,
                                              definition,
                                              { returnParam },
                                              vectorParams,
                                              false,
                                              { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::withAllocator },
                                              raii,
                                              false,
                                              { CommandFlavourFlagBits::enhanced } );
        }
        else
        {
          if ( !isHandleType( commandData.params[vectorParams.begin()->first].type.type ) &&
               !isStructureChainAnchor( commandData.params[vectorParams.begin()->first].type.type ) &&
               ( commandData.params[vectorParams.begin()->first].type.type != "void" ) )
          {
            if ( isLenByStructMember( commandData.params[vectorParams.begin()->first].lenExpression,
                                      commandData.params[vectorParams.begin()->second.lenParam] ) )
            {
              return generateCommandSetInclusive( name,
                                                  commandData,
                                                  initialSkipCount,
                                                  definition,
                                                  { returnParam },
                                                  vectorParams,
                                                  false,
                                                  { CommandFlavourFlagBits::enhanced },
                                                  raii,
                                                  false,
                                                  { CommandFlavourFlagBits::enhanced } );
            }
          }
        }
        break;
      default: break;
    }
  }
  return "";
}